

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O1

int8_t labpack_read_i8(labpack_reader_t *reader)

{
  mpack_error_t error;
  int8_t iVar1;
  char *pcVar2;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      iVar1 = mpack_expect_i8(reader->decoder);
      error = reader->decoder->error;
      if (error != mpack_ok) {
        reader->status = LABPACK_STATUS_ERROR_DECODER;
        pcVar2 = labpack_mpack_error_message(error);
        reader->status_message = pcVar2;
      }
    }
    else {
      iVar1 = '\0';
    }
    return iVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0xd0,"int8_t labpack_read_i8(labpack_reader_t *)");
}

Assistant:

int8_t
labpack_read_i8(labpack_reader_t* reader)
{
    assert(reader);
    int8_t value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_i8(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}